

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void * myEmployeeCustomConstructor::ArchiveINconstructor(ChArchiveIn *marchive)

{
  myEmployeeCustomConstructor *this;
  int kids;
  double latitude;
  int local_4c;
  double local_48;
  char *local_40;
  double *local_38;
  undefined1 local_30;
  
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  local_40 = "latitude";
  local_38 = &local_48;
  local_30 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_40);
  local_40 = "kids";
  local_38 = (double *)&local_4c;
  local_30 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_40);
  this = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor(this,local_4c,local_48);
  return this;
}

Assistant:

static void* ArchiveINconstructor(ChArchiveIn& marchive)
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();

        // 1) Deserialize the parameters of the constructor:
        // you need some auxiliary variables because this method is static 
        // (the object will be created right after the >> parsing)
        // Note, be sure that the names of those auxiliary vars are the same of member 
        // variables of your class, or use  CHNVP(..., "myname") tags.
        double latitude;   
        int    kids;
        marchive >> CHNVP(latitude);
        marchive >> CHNVP(kids);

        // 2) Important!!! Finally you MUST return an object of this class, 
        // constructed with the parameters that you just deserialized:
        return new myEmployeeCustomConstructor(kids, latitude);
    }